

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  int *piVar1;
  int iVar2;
  Value VVar3;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  undefined4 uVar7;
  int iVar8;
  Node *pNVar9;
  Node *pNVar10;
  Node *pNVar11;
  TValue *pTVar12;
  long lVar13;
  int lg;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint ause;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  char *fmt;
  uint uVar21;
  Node *pNVar22;
  TValue *io_;
  int iVar23;
  lua_Integer k;
  TValue aux;
  Value local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Value local_40;
  undefined4 local_38;
  
  if (key->tt_ == 3) {
    iVar17 = luaV_tointeger(key,&local_c8.i,0);
    if (iVar17 == 0) {
      if (NAN((key->value_).n)) {
        fmt = "table index is NaN";
        goto LAB_001112d4;
      }
    }
    else {
      key = (TValue *)&local_40;
      local_40 = local_c8;
      local_38 = 0x13;
    }
  }
  else if (key->tt_ == 0) {
    fmt = "table index is nil";
LAB_001112d4:
    luaG_runerror(L,fmt);
  }
  pNVar9 = mainposition(t,key);
  if (((pNVar9->i_val).tt_ != 0) || (t->lastfree == (Node *)0x0)) {
    if (t->lastfree == (Node *)0x0) {
LAB_0011101e:
      pNVar22 = (Node *)0x0;
    }
    else {
      pNVar10 = t->lastfree;
      do {
        if (pNVar10 <= t->node) goto LAB_0011101e;
        pNVar22 = pNVar10 + -1;
        t->lastfree = pNVar22;
        pNVar11 = pNVar10 + -1;
        pNVar10 = pNVar22;
      } while ((pNVar11->i_key).nk.tt_ != 0);
    }
    if (pNVar22 == (Node *)0x0) {
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8.gc = (GCObject *)0x0;
      uStack_c0 = 0;
      uVar20 = t->sizearray;
      lVar13 = 0;
      uVar14 = 1;
      iVar17 = 0;
      uVar19 = 1;
      do {
        uVar21 = uVar19;
        if ((uVar20 < uVar19) && (uVar21 = uVar20, uVar20 < uVar14)) {
          bVar6 = false;
        }
        else {
          iVar16 = 0;
          uVar15 = uVar14;
          if (uVar14 <= uVar21) {
            uVar15 = uVar21 + 1;
            if (uVar21 + 1 < uVar14 + 1) {
              uVar15 = uVar14 + 1;
            }
            uVar14 = uVar14 - 1;
            iVar16 = 0;
            do {
              iVar16 = (iVar16 + 1) - (uint)(t->array[uVar14].tt_ == 0);
              iVar23 = uVar14 - uVar15;
              uVar14 = uVar14 + 1;
            } while (iVar23 != -2);
          }
          piVar1 = (int *)((long)&local_c8 + lVar13 * 4);
          *piVar1 = *piVar1 + iVar16;
          iVar17 = iVar17 + iVar16;
          bVar6 = true;
          uVar14 = uVar15;
        }
        if (!bVar6) break;
        lVar13 = lVar13 + 1;
        uVar19 = uVar19 * 2;
      } while (lVar13 != 0x20);
      uVar18 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) << 5 | 0x10;
      iVar23 = 0;
      iVar16 = 0;
      do {
        if (*(int *)((long)t->node + (uVar18 - 8)) != 0) {
          iVar8 = countint((TValue *)((long)&(t->node->i_val).value_ + uVar18),(uint *)&local_c8.b);
          iVar16 = iVar16 + iVar8;
          iVar23 = iVar23 + 1;
        }
        uVar18 = uVar18 - 0x20;
      } while (uVar18 != 0xfffffffffffffff0);
      iVar8 = countint(key,(uint *)&local_c8.b);
      uVar20 = 1;
      lVar13 = 0;
      uVar14 = 0;
      uVar19 = 0;
      uVar21 = 0;
      do {
        if ((uint)(iVar8 + iVar16 + iVar17) <= uVar20 >> 1) break;
        iVar2 = *(int *)((long)&local_c8 + lVar13 * 4);
        uVar21 = uVar21 + iVar2;
        uVar15 = uVar14;
        uVar5 = uVar19;
        if (uVar20 >> 1 < uVar21) {
          uVar15 = uVar20;
          uVar5 = uVar21;
        }
        if (iVar2 != 0) {
          uVar14 = uVar15;
          uVar19 = uVar5;
        }
        lVar13 = lVar13 + 1;
        uVar20 = uVar20 * 2;
      } while (lVar13 != 0x20);
      luaH_resize(L,t,uVar14,((iVar17 + iVar23) - uVar19) + 1);
      pTVar12 = luaH_set(L,t,key);
    }
    else {
      pNVar10 = mainposition(t,&(pNVar9->i_key).tvk);
      if (pNVar10 == pNVar9) {
        lVar13 = (long)(pNVar9->i_key).nk.next;
        if (lVar13 != 0) {
          (pNVar22->i_key).nk.next =
               (int)((ulong)((long)pNVar9 + (lVar13 * 0x20 - (long)pNVar22)) >> 5);
        }
        pTVar12 = (TValue *)((ulong)((long)pNVar22 - (long)pNVar9) >> 5);
        (pNVar9->i_key).nk.next = (int)pTVar12;
        pNVar9 = pNVar22;
      }
      else {
        do {
          pNVar11 = pNVar10;
          pNVar10 = pNVar11 + (pNVar11->i_key).nk.next;
        } while (pNVar11 + (pNVar11->i_key).nk.next != pNVar9);
        pTVar12 = (TValue *)((ulong)((long)pNVar22 - (long)pNVar11) >> 5);
        (pNVar11->i_key).nk.next = (int)pTVar12;
        VVar3 = (pNVar9->i_val).value_;
        iVar17 = (pNVar9->i_val).tt_;
        uVar7 = *(undefined4 *)&(pNVar9->i_val).field_0xc;
        uVar4 = *(undefined8 *)((long)&pNVar9->i_key + 8);
        (pNVar22->i_key).nk.value_ = (pNVar9->i_key).nk.value_;
        *(undefined8 *)((long)&pNVar22->i_key + 8) = uVar4;
        (pNVar22->i_val).value_ = VVar3;
        (pNVar22->i_val).tt_ = iVar17;
        *(undefined4 *)&(pNVar22->i_val).field_0xc = uVar7;
        if ((pNVar9->i_key).nk.next != 0) {
          pTVar12 = (TValue *)((ulong)((long)pNVar9 - (long)pNVar22) >> 5);
          piVar1 = &(pNVar22->i_key).nk.next;
          *piVar1 = *piVar1 + (int)pTVar12;
          (pNVar9->i_key).nk.next = 0;
        }
        (pNVar9->i_val).tt_ = 0;
      }
    }
    if (pNVar22 == (Node *)0x0) {
      return pTVar12;
    }
  }
  (pNVar9->i_key).nk.value_ = key->value_;
  (pNVar9->i_key).nk.tt_ = ((Value *)((long)key + 8))->b;
  if (((((ulong)*(Value *)((long)key + 8) & 0x40) != 0) && ((t->marked & 4) != 0)) &&
     (((*(GCObject **)key)->marked & 3) != 0)) {
    luaC_barrierback_(L,t);
  }
  return &pNVar9->i_val;
}

Assistant:

TValue *luaH_newkey (lua_State *L, Table *t, const TValue *key) {
  Node *mp;
  TValue aux;
  if (ttisnil(key)) luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Integer k;
    if (luaV_tointeger(key, &k, 0)) {  /* does index fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (luai_numisnan(fltvalue(key)))
      luaG_runerror(L, "table index is NaN");
  }
  mp = mainposition(t, key);
  if (!ttisnil(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      return luaH_set(L, t, key);  /* insert key into grown table */
    }
    lua_assert(!isdummy(t));
    othern = mainposition(t, gkey(mp));
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setnilvalue(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, &mp->i_key, key);
  luaC_barrierback(L, t, key);
  lua_assert(ttisnil(gval(mp)));
  return gval(mp);
}